

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::Aborted::receive(Aborted *this,size_t maxSize)

{
  char (*in_RCX) [41];
  Array<char> local_1c0;
  Exception local_1a8;
  
  kj::_::Debug::makeDescription<char_const(&)[41]>
            ((String *)&local_1c0,(Debug *)"\"other end of WebSocketPipe was destroyed\"",
             "other end of WebSocketPipe was destroyed",in_RCX);
  Exception::Exception
            (&local_1a8,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x114a,(String *)&local_1c0);
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::Promise
            ((Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)this
             ,&local_1a8);
  Exception::~Exception(&local_1a8);
  Array<char>::~Array(&local_1c0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<Message> receive(size_t maxSize) override {
      return KJ_EXCEPTION(DISCONNECTED, "other end of WebSocketPipe was destroyed");
    }